

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.hpp
# Opt level: O0

void __thiscall
toml::basic_value<toml::type_config>::basic_value
          (basic_value<toml::type_config> *this,array_type *x,array_format_info fmt,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *com,region_type *reg)

{
  format_type f;
  vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
  *in_RDI;
  region *in_R8;
  value_type *in_stack_ffffffffffffff48;
  region *c;
  undefined4 uVar1;
  undefined1 *puVar2;
  undefined1 local_60 [96];
  
  *(undefined1 *)
   &(in_RDI->
    super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
    )._M_impl.super__Vector_impl_data._M_start = 9;
  uVar1 = (undefined4)
          ((ulong)&(in_RDI->
                   super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish >> 0x20);
  puVar2 = local_60;
  std::
  vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
  ::vector((vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
            *)in_R8,in_stack_ffffffffffffff48);
  toml::detail::
  storage<std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
  ::storage((storage<std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
             *)in_R8,in_stack_ffffffffffffff48);
  f._4_8_ = puVar2;
  f.fmt = (char)uVar1;
  f.indent_type = (char)((uint)uVar1 >> 8);
  f._2_2_ = (short)((uint)uVar1 >> 0x10);
  toml::detail::
  value_with_format<toml::detail::storage<std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>,_toml::array_format_info>
  ::value_with_format((value_with_format<toml::detail::storage<std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>,_toml::array_format_info>
                       *)in_R8,(value_type *)in_stack_ffffffffffffff48,f);
  toml::detail::
  storage<std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
  ::~storage((storage<std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
              *)0x6aa752);
  std::
  vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
  ::~vector(in_RDI);
  c = (region *)(in_RDI + 3);
  toml::detail::region::region(in_R8,c);
  preserve_comments::preserve_comments
            ((preserve_comments *)in_R8,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)c);
  return;
}

Assistant:

basic_value(array_type x, array_format_info fmt,
                std::vector<std::string> com, region_type reg)
        : type_(value_t::array), array_(array_storage(
              detail::storage<array_type>(std::move(x)), std::move(fmt)
          )), region_(std::move(reg)), comments_(std::move(com))
    {}